

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPrimal.cpp
# Opt level: O2

void __thiscall HPrimal::primalChooseColumn(HPrimal *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  HModel *pHVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  
  this->columnIn = -1;
  pHVar4 = this->model;
  piVar5 = (pHVar4->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (pHVar4->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (pHVar4->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (pHVar4->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (pHVar4->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pHVar4->dblOption[2];
  uVar11 = 0;
  uVar10 = (ulong)(uint)this->numTot;
  if (this->numTot < 1) {
    uVar10 = uVar11;
  }
  dVar12 = 0.0;
  do {
    if (uVar10 == uVar11) {
      return;
    }
    if (piVar5[uVar11] != 0) {
      dVar2 = pdVar7[uVar11];
      dVar13 = ABS(dVar2);
      if (dVar1 < dVar13) {
        dVar3 = pdVar8[uVar11];
        if ((((dVar3 == -1e+200) && (!NAN(dVar3))) && (dVar3 = pdVar9[uVar11], dVar3 == 1e+200)) &&
           (!NAN(dVar3))) {
          this->columnIn = (int)uVar11;
          return;
        }
        if ((dVar2 * (double)piVar6[uVar11] < -dVar1) && (dVar12 < dVar13)) {
          this->columnIn = (int)uVar11;
          dVar12 = dVar13;
        }
      }
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void HPrimal::primalChooseColumn() {
    columnIn = -1;
    double bestInfeas = 0;
    const int *jFlag = model->getNonbasicFlag();
    const int *jMove = model->getNonbasicMove();
    double *workDual = model->getWorkDual();
    const double *workLower = model->getWorkLower();
    const double *workUpper = model->getWorkUpper();
    const double dualTolerance = model->dblOption[DBLOPT_DUAL_TOL];

    for (int iCol = 0; iCol < numTot; iCol++) {
        if (jFlag[iCol] && fabs(workDual[iCol]) > dualTolerance) {
            // Always take free
            // TODO: if we found free,
            // Then deal with it in dual phase 1
            if (workLower[iCol] == -HSOL_CONST_INF
                    && workUpper[iCol] == HSOL_CONST_INF) {
                columnIn = iCol;
                break;
            }
            // Then look at dual infeasible
            if (jMove[iCol] * workDual[iCol] < -dualTolerance) {
                if (bestInfeas < fabs(workDual[iCol])) {
                    bestInfeas = fabs(workDual[iCol]);
                    columnIn = iCol;
                }
            }
        }
    }
}